

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall
cmCTestBuildHandler::GenerateXMLFooter
          (cmCTestBuildHandler *this,cmXMLWriter *xml,double elapsed_build_time)

{
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  allocator local_51;
  double local_50;
  string local_48;
  undefined1 local_28 [16];
  
  local_28._8_4_ = in_XMM0_Dc;
  local_28._0_8_ = elapsed_build_time;
  local_28._12_4_ = in_XMM0_Dd;
  std::__cxx11::string::string((string *)&local_48,"Log",(allocator *)&local_50);
  cmXMLWriter::StartElement(xml,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  cmXMLWriter::Attribute<char[7]>(xml,"Encoding",(char (*) [7])"base64");
  cmXMLWriter::Attribute<char[9]>(xml,"Compression",(char (*) [9])"bin/gzip");
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string((string *)&local_48,"EndDateTime",(allocator *)&local_50);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_48,&this->EndBuild);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"EndBuildTime",&local_51);
  local_50 = (double)CONCAT44(local_50._4_4_,(int)(long)this->EndBuildTime);
  cmXMLWriter::Element<unsigned_int>(xml,&local_48,(uint *)&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"ElapsedMinutes",&local_51);
  local_50 = (double)(int)((double)local_28._0_8_ / 6.0) / 10.0;
  cmXMLWriter::Element<double>(xml,&local_48,&local_50);
  std::__cxx11::string::~string((string *)&local_48);
  cmXMLWriter::EndElement(xml);
  cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,xml);
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLFooter(cmXMLWriter& xml,
                                            double elapsed_build_time)
{
  xml.StartElement("Log");
  xml.Attribute("Encoding", "base64");
  xml.Attribute("Compression", "bin/gzip");
  xml.EndElement(); // Log

  xml.Element("EndDateTime", this->EndBuild);
  xml.Element("EndBuildTime", static_cast<unsigned int>(this->EndBuildTime));
  xml.Element("ElapsedMinutes", static_cast<int>(elapsed_build_time/6)/10.0);
  xml.EndElement(); // Build
  this->CTest->EndXML(xml);
}